

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

int Ssw_SecWithSimilarityPairs(Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairs,Ssw_Pars_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Aig_Man_t *p;
  abctime aVar3;
  char *format;
  int level;
  Aig_Man_t *pAVar4;
  Ssw_Pars_t Pars;
  
  aVar2 = Abc_Clock();
  if (pPars == (Ssw_Pars_t *)0x0) {
    Ssw_ManSetDefaultParams(&Pars);
    pPars = &Pars;
  }
  p = Ssw_SecWithSimilaritySweep(p0,p1,vPairs,pPars);
  pAVar4 = p;
  iVar1 = Ssw_MiterStatus(p,1);
  level = (int)pAVar4;
  if (iVar1 == 0) {
    format = "Verification failed with a counter-example.  ";
  }
  else {
    if (iVar1 != 1) {
      Abc_Print(level,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)(uint)p->nRegs,(ulong)(uint)(p1->nRegs + p0->nRegs));
      goto LAB_00567488;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(level,format);
LAB_00567488:
  Abc_Print(level,"%s =","Time");
  aVar3 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecWithSimilarityPairs( Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairs, Ssw_Pars_t * pPars )
{
    Ssw_Pars_t Pars;
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    // derive parameters if not given
    if ( pPars == NULL )
        Ssw_ManSetDefaultParams( pPars = &Pars );
    // reduce the AIG with pairs
    pAigRes = Ssw_SecWithSimilaritySweep( p0, p1, vPairs, pPars );
    // report the result of verification
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(p0)+Aig_ManRegNum(p1) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    Aig_ManStop( pAigRes );
    return RetValue;
}